

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O0

ARKodeSPRKTable ARKodeSPRKTable_Copy(ARKodeSPRKTable that_sprk_table)

{
  ARKodeSPRKTable pAVar1;
  int *in_RDI;
  ARKodeSPRKTable sprk_table;
  int i;
  int local_c;
  
  pAVar1 = ARKodeSPRKTable_Alloc(0);
  pAVar1->q = *in_RDI;
  for (local_c = 0; local_c < pAVar1->stages; local_c = local_c + 1) {
    pAVar1->ahat[local_c] = *(sunrealtype *)(*(long *)(in_RDI + 4) + (long)local_c * 8);
    pAVar1->a[local_c] = *(sunrealtype *)(*(long *)(in_RDI + 2) + (long)local_c * 8);
  }
  return pAVar1;
}

Assistant:

ARKodeSPRKTable ARKodeSPRKTable_Copy(ARKodeSPRKTable that_sprk_table)
{
  int i                      = 0;
  ARKodeSPRKTable sprk_table = NULL;

  sprk_table = ARKodeSPRKTable_Alloc(that_sprk_table->stages);

  sprk_table->q = that_sprk_table->q;

  for (i = 0; i < sprk_table->stages; ++i)
  {
    sprk_table->ahat[i] = that_sprk_table->ahat[i];
    sprk_table->a[i]    = that_sprk_table->a[i];
  }

  return sprk_table;
}